

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q2.cpp
# Opt level: O3

BSTree<const_int_&,_int>
bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
          (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *end,
          int *default_value)

{
  undefined8 in_RCX;
  pointer *__ptr;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  void *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  
  local_48._M_current = (int *)0x0;
  local_38 = 0;
  local_40 = operator_new(0x18);
  *(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> **)local_40 = &local_48;
  *(undefined8 *)((long)local_40 + 8) = in_RCX;
  *(void ***)((long)local_40 + 0x10) = &local_40;
  local_28 = std::
             _Function_handler<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/luizalbertocviana[P]cracking-coding-problems/ch4/q2.cpp:21:22)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/luizalbertocviana[P]cracking-coding-problems/ch4/q2.cpp:21:22)>
             ::_M_manager;
  std::
  __invoke_impl<void,bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,int_const&)::_lambda(auto:1_const&,auto:2_const&)_1_&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&>
            (local_40,end,default_value);
  begin->_M_current = (int *)local_48;
  local_48._M_current = (int *)0x0;
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
    if ((BSTreeNode *)local_48._M_current != (BSTreeNode *)0x0) {
      std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>::operator()
                ((default_delete<BSTree<const_int_&,_int>::BSTreeNode> *)&local_48,
                 (BSTreeNode *)local_48._M_current);
    }
  }
  return (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)
         (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)begin;
}

Assistant:

auto bstree_from_sorted(const Iterator& begin, const Iterator& end, const Val& default_value){
  // we are going to use Key as the type of elements within range
  // [begin, end)
  using Key      = decltype(*begin);
  // we are going to use a recursive function to perform the insertions
  using Function = std::function<void(const Iterator&, const Iterator&)>;

  // an empty BSTree
  BSTree<Key, Val> bst {};

  Function inserter {[&bst, &default_value, &inserter](const auto& begin, const auto& end) {
                       // if range is not empty
                       if (begin < end){
                         // we calculate half of the range length
                         auto length      {std::distance(begin, end)};
                         auto half_length {length / 2};

                         // we insert the middle element (odd length)
                         // or the first element of second half (even
                         // length)
                         bst.insert(*(begin + half_length), default_value);

                         // we recurse into each half, excluding the
                         // element that was just inserted
                         inserter(begin, begin + half_length);
                         inserter(begin + half_length + 1, end);
                       }
                     }};

  // we begin the insertion process to the whole range
  inserter(begin, end);

  // at the end, we return the BSTree
  return bst;
}